

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

void __thiscall ON_CurveArray::Destroy(ON_CurveArray *this)

{
  ON_Curve *pOVar1;
  int iVar2;
  int local_14;
  int i;
  ON_CurveArray *this_local;
  
  local_14 = (this->super_ON_SimpleArray<ON_Curve_*>).m_capacity;
  while (iVar2 = local_14 + -1, 0 < local_14) {
    local_14 = iVar2;
    if ((this->super_ON_SimpleArray<ON_Curve_*>).m_a[iVar2] != (ON_Curve *)0x0) {
      pOVar1 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a[iVar2];
      if (pOVar1 != (ON_Curve *)0x0) {
        (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      (this->super_ON_SimpleArray<ON_Curve_*>).m_a[iVar2] = (ON_Curve *)0x0;
    }
  }
  ON_SimpleArray<ON_Curve_*>::Empty(&this->super_ON_SimpleArray<ON_Curve_*>);
  return;
}

Assistant:

void ON_CurveArray::Destroy()
{
  int i = m_capacity;
  while ( i-- > 0 ) {
    if ( m_a[i] ) {
      delete m_a[i];
      m_a[i] = nullptr;
    }
  }
  Empty();
}